

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseTypeVector(JSONParser *this,TypeVector *out_types)

{
  bool bVar1;
  Result RVar2;
  Type local_34;
  Type type;
  bool first;
  TypeVector *out_types_local;
  JSONParser *this_local;
  
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(out_types);
  RVar2 = Expect(this,"[");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    type.type_index_._3_1_ = 1;
    while (bVar1 = Match(this,"]"), ((bVar1 ^ 0xffU) & 1) != 0) {
      if ((type.type_index_._3_1_ & 1) == 0) {
        type.enum_ = (Enum)Expect(this,",");
        bVar1 = wabt::Failed((Result)type.enum_);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      RVar2 = ParseTypeObject(this,&local_34);
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      type.type_index_._3_1_ = 0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_types,&local_34);
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseTypeVector(TypeVector* out_types) {
  out_types->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    Type type;
    CHECK_RESULT(ParseTypeObject(&type));
    first = false;
    out_types->push_back(type);
  }
  return wabt::Result::Ok;
}